

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::VerifyPageHeapFillAfterAlloc
          (Recycler *this,char *memBlock,size_t size,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LargeHeapBlock *this_00;
  IdleDecommitPageAllocator *pIVar4;
  
  if (memBlock == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1e54,"(memBlock != nullptr)","memBlock != nullptr");
    if (!bVar2) goto LAB_007218c5;
    *puVar3 = 0;
  }
  if (this->isPageHeapEnabled == true) {
    if (((ulong)memBlock & 0xf) == 0 && (char *)0xffff < memBlock) {
      this_00 = (LargeHeapBlock *)HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,memBlock);
    }
    else {
      this_00 = (LargeHeapBlock *)0x0;
    }
    if (this_00 == (LargeHeapBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1e58,"(heapBlock)","heapBlock");
      if (!bVar2) {
LAB_007218c5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (((((this_00->super_HeapBlock).heapBlockType == LargeBlockType) &&
         (this_00->pageHeapData != (PageHeapData *)0x0)) &&
        (this_00->pageHeapData->pageHeapMode != PageHeapModeOff)) &&
       (pIVar4 = HeapInfo::GetRecyclerLargeBlockPageAllocator(this_00->heapInfo),
       (pIVar4->super_PageAllocator).disablePageReuse == false)) {
      LargeHeapBlock::VerifyPageHeapPattern(this_00);
      return;
    }
  }
  return;
}

Assistant:

void Recycler::VerifyPageHeapFillAfterAlloc(char* memBlock, size_t size, ObjectInfoBits attributes)
{
    Assert(memBlock != nullptr);
    if (IsPageHeapEnabled())
    {
        HeapBlock* heapBlock = this->FindHeapBlock(memBlock);
        Assert(heapBlock);
        if (heapBlock->IsLargeHeapBlock())
        {
            LargeHeapBlock* largeHeapBlock = (LargeHeapBlock*)heapBlock;
            if (largeHeapBlock->InPageHeapMode()
#ifdef RECYCLER_NO_PAGE_REUSE
                && !largeHeapBlock->GetPageAllocator(largeHeapBlock->heapInfo)->IsPageReuseDisabled()
#endif
                )
            {
                largeHeapBlock->VerifyPageHeapPattern();
            }
        }
    }
}